

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::MapFieldBase::SyncRepeatedFieldWithMap(MapFieldBase *this)

{
  State SVar1;
  Arena *this_00;
  int iVar2;
  RepeatedPtrField<google::protobuf::Message> *pRVar3;
  
  SVar1 = (this->state_)._M_i;
  if (SVar1 == CLEAN) {
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
    if (iVar2 != 0) goto LAB_0028c7ff;
    if ((this->state_)._M_i != CLEAN) goto LAB_0028c7dc;
    if (this->repeated_field_ == (RepeatedPtrField<google::protobuf::Message> *)0x0) {
      this_00 = this->arena_;
      if (this_00 == (Arena *)0x0) {
        pRVar3 = (RepeatedPtrField<google::protobuf::Message> *)operator_new(0x18);
        (pRVar3->super_RepeatedPtrFieldBase).arena_ = (Arena *)0x0;
        (pRVar3->super_RepeatedPtrFieldBase).current_size_ = 0;
        (pRVar3->super_RepeatedPtrFieldBase).total_size_ = 0;
        (pRVar3->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
      }
      else {
        if (this_00->hooks_cookie_ != (void *)0x0) {
          Arena::OnArenaAllocation
                    (this_00,(type_info *)&RepeatedPtrField<google::protobuf::Message>::typeinfo,
                     0x18);
        }
        pRVar3 = (RepeatedPtrField<google::protobuf::Message> *)
                 ArenaImpl::AllocateAlignedAndAddCleanup
                           (&this_00->impl_,0x18,
                            arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                           );
        (pRVar3->super_RepeatedPtrFieldBase).arena_ = this_00;
        (pRVar3->super_RepeatedPtrFieldBase).current_size_ = 0;
        (pRVar3->super_RepeatedPtrFieldBase).total_size_ = 0;
        (pRVar3->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
      }
      this->repeated_field_ = pRVar3;
    }
  }
  else {
    if (SVar1 != STATE_MODIFIED_MAP) {
      return;
    }
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
    if (iVar2 != 0) {
LAB_0028c7ff:
      std::__throw_system_error(iVar2);
    }
    if ((this->state_)._M_i != STATE_MODIFIED_MAP) goto LAB_0028c7dc;
    (*this->_vptr_MapFieldBase[0xd])(this);
  }
  (this->state_)._M_i = CLEAN;
LAB_0028c7dc:
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return;
}

Assistant:

void MapFieldBase::SyncRepeatedFieldWithMap() const {
  // acquire here matches with release below to ensure that we can only see a
  // value of CLEAN after all previous changes have been synced.
  switch (state_.load(std::memory_order_acquire)) {
    case STATE_MODIFIED_MAP:
      mutex_.Lock();
      // Double check state, because another thread may have seen the same
      // state and done the synchronization before the current thread.
      if (state_.load(std::memory_order_relaxed) == STATE_MODIFIED_MAP) {
        SyncRepeatedFieldWithMapNoLock();
        state_.store(CLEAN, std::memory_order_release);
      }
      mutex_.Unlock();
      break;
    case CLEAN:
      mutex_.Lock();
      // Double check state
      if (state_.load(std::memory_order_relaxed) == CLEAN) {
        if (repeated_field_ == nullptr) {
          if (arena_ == nullptr) {
            repeated_field_ = new RepeatedPtrField<Message>();
          } else {
            repeated_field_ =
                Arena::CreateMessage<RepeatedPtrField<Message> >(arena_);
          }
        }
        state_.store(CLEAN, std::memory_order_release);
      }
      mutex_.Unlock();
      break;
    default:
      break;
  }
}